

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

QLocalSocket * __thiscall QLocalServer::nextPendingConnection(QLocalServer *this)

{
  long lVar1;
  iterator iVar2;
  long lVar3;
  QLocalSocket *pQVar4;
  
  lVar1 = *(long *)&this->field_0x8;
  if (*(long *)(lVar1 + 0xd0) == 0) {
    pQVar4 = (QLocalSocket *)0x0;
  }
  else {
    iVar2 = QList<QLocalSocket_*>::begin((QList<QLocalSocket_*> *)(lVar1 + 0xc0));
    pQVar4 = *iVar2.i;
    *(long *)(lVar1 + 200) = *(long *)(lVar1 + 200) + 8;
    lVar3 = *(long *)(lVar1 + 0xd0) + -1;
    *(long *)(lVar1 + 0xd0) = lVar3;
    if (lVar3 <= *(int *)(lVar1 + 0xb8)) {
      QSocketNotifier::setEnabled(SUB81(*(undefined8 *)(lVar1 + 0x80),0));
    }
  }
  return pQVar4;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }